

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_int>
          (Memory *this,u32 offset,u32 addend,uint expect,uint replace,uint *out)

{
  bool bVar1;
  Result RVar2;
  uint local_34;
  uint *puStack_30;
  uint read;
  uint *out_local;
  uint replace_local;
  uint expect_local;
  u32 addend_local;
  u32 offset_local;
  Memory *this_local;
  
  puStack_30 = out;
  out_local._0_4_ = replace;
  out_local._4_4_ = expect;
  replace_local = addend;
  expect_local = offset;
  _addend_local = this;
  RVar2 = AtomicLoad<unsigned_int>(this,offset,addend,&local_34);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (local_34 == out_local._4_4_) {
      RVar2 = AtomicStore<unsigned_int>(this,expect_local,replace_local,(uint)out_local);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    *puStack_30 = local_34;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u32 offset,
                                u32 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}